

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::GetIntCase::iterate(GetIntCase *this)

{
  ostringstream *this_00;
  TestContext *this_01;
  GLenum err;
  GLint value;
  GLint local_1b4;
  Enum<int,_2UL> local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_1b4 = 0;
  glwGetIntegerv(this->m_param,&local_1b4);
  err = glwGetError();
  glu::checkError(err,"glGetIntegerv(m_param, &value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/tes2CapabilityTests.cpp"
                  ,0x38);
  local_190._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_1b0.m_value = this->m_param;
  local_1b0.m_getName = glu::getParamQueryName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
  std::ostream::operator<<(this_00,local_1b4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ostream::operator<<((ostringstream *)local_190,local_1b4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_1b0.m_getName);
  if (local_1b0.m_getName != (GetNameFunc)local_1a0) {
    operator_delete(local_1b0.m_getName,local_1a0[0] + 1);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		GLint value = 0;
		GLU_CHECK_CALL(glGetIntegerv(m_param, &value));

		m_testCtx.getLog() << TestLog::Message << glu::getParamQueryStr(m_param) << " = " << value << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(value).c_str());
		return STOP;
	}